

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::RandomBufferWriteCase::iterate(RandomBufferWriteCase *this)

{
  size_type *psVar1;
  CallLogWrapper *this_00;
  GLenum usage;
  int iVar2;
  TestLog *this_01;
  deUint8 *ptr;
  pointer pVVar3;
  bool bVar4;
  ReferenceBuffer *pRVar5;
  uint uVar6;
  deUint32 dVar7;
  int iVar8;
  undefined8 *puVar9;
  long *plVar10;
  TestError *this_02;
  int iVar11;
  ulong *puVar12;
  pointer puVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *in_R9;
  uint uVar17;
  int iVar18;
  long offset;
  pointer pVVar19;
  int numBytes;
  float fVar20;
  Random rnd;
  string local_330;
  ReferenceBuffer *local_310;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  string local_2e8;
  vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *local_2c8;
  ulong local_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  code *local_298;
  GLenum local_290;
  undefined4 uStack_28c;
  ulong local_288 [2];
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  LogSection local_1f8;
  deRandom local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  uVar6 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  deRandom_init(&local_1b8,uVar6 >> 0xf ^ this->m_seed ^ uVar6 ^ 0xacf92e);
  this_01 = ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_298 = (code *)local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Iteration","");
  iVar18 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar18 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar16 = local_210 + CONCAT44(uStack_28c,local_290);
  uVar15 = 0xf;
  if (local_298 != (code *)local_288) {
    uVar15 = local_288[0];
  }
  if (uVar15 < uVar16) {
    in_R9 = local_208;
    uVar15 = 0xf;
    if (local_218 != in_R9) {
      uVar15 = local_208[0];
    }
    if (uVar15 < uVar16) goto LAB_003879fa;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_298);
  }
  else {
LAB_003879fa:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_218);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_330.field_2._M_allocated_capacity = *psVar1;
    local_330.field_2._8_4_ = *(undefined4 *)(puVar9 + 3);
    local_330.field_2._12_4_ = *(undefined4 *)((long)puVar9 + 0x1c);
  }
  else {
    local_330.field_2._M_allocated_capacity = *psVar1;
    local_330._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_330._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Iteration ","");
  iVar18 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar18 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar16 = 0xf;
  if (local_238 != local_228) {
    uVar16 = local_228[0];
  }
  if (uVar16 < (ulong)(local_250 + local_230)) {
    in_R9 = local_248;
    uVar16 = 0xf;
    if (local_258 != in_R9) {
      uVar16 = local_248[0];
    }
    if (uVar16 < (ulong)(local_250 + local_230)) goto LAB_00387b42;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_00387b42:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_258);
  }
  local_308 = &local_2f8;
  plVar10 = puVar9 + 2;
  if ((long *)*puVar9 == plVar10) {
    local_2f8 = *plVar10;
    uStack_2f0 = puVar9[3];
  }
  else {
    local_2f8 = *plVar10;
    local_308 = (long *)*puVar9;
  }
  local_300 = puVar9[1];
  *puVar9 = plVar10;
  puVar9[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_308);
  puVar12 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar12) {
    local_2a8 = *puVar12;
    lStack_2a0 = plVar10[3];
    local_2b8 = &local_2a8;
  }
  else {
    local_2a8 = *puVar12;
    local_2b8 = (ulong *)*plVar10;
  }
  local_2b0 = plVar10[1];
  *plVar10 = (long)puVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar16 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar16 = local_2a8;
  }
  if (uVar16 < (ulong)(local_270 + local_2b0)) {
    in_R9 = local_268;
    uVar16 = 0xf;
    if (local_278 != in_R9) {
      uVar16 = local_268[0];
    }
    if ((ulong)(local_270 + local_2b0) <= uVar16) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2b8);
      goto LAB_00387cdc;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_278);
LAB_00387cdc:
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2e8.field_2._M_allocated_capacity = *psVar1;
    local_2e8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar1;
    local_2e8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2e8._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::LogSection::LogSection(&local_1f8,&local_330,&local_2e8);
  tcu::TestLog::startSection
            (this_01,local_1f8.m_name._M_dataplus._M_p,local_1f8.m_description._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_description._M_dataplus._M_p != &local_1f8.m_description.field_2) {
    operator_delete(local_1f8.m_description._M_dataplus._M_p,
                    local_1f8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_name._M_dataplus._M_p != &local_1f8.m_name.field_2) {
    operator_delete(local_1f8.m_name._M_dataplus._M_p,
                    local_1f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  if (local_298 != (code *)local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  local_310 = &this->m_refBuffer;
  local_2c8 = (vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&this->m_validRanges;
  local_2c0 = 0;
  iVar18 = 7;
  do {
    dVar7 = deRandom_getUint32(&local_1b8);
    uVar6 = iterate::bufferTargets[dVar7 & 1];
    if (this->m_curSize == 0) {
      bVar4 = true;
    }
    else {
      fVar20 = deRandom_getFloat(&local_1b8);
      bVar4 = fVar20 < 0.07;
    }
    if (uVar6 != (uint)local_2c0) {
      glu::CallLogWrapper::glBindBuffer(this_00,uVar6,this->m_buffer);
      local_2c0 = (ulong)uVar6;
    }
    if (bVar4) {
      dVar7 = deRandom_getUint32(&local_1b8);
      uVar17 = dVar7 % 0x7ff5 + 0xc;
      dVar7 = deRandom_getUint32(&local_1b8);
      usage = iterate::usageHints[dVar7 % 3];
      fVar20 = deRandom_getFloat(&local_1b8);
      BufferTestUtil::ReferenceBuffer::setSize(local_310,uVar17);
      if (0.2 <= fVar20) {
        puVar13 = (pointer)0x0;
      }
      else {
        ptr = (local_310->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
        dVar7 = deRandom_getUint32(&local_1b8);
        pRVar5 = local_310;
        BufferTestUtil::fillWithRandomBytes(ptr,uVar17,dVar7);
        puVar13 = (pRVar5->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      glu::CallLogWrapper::glBufferData(this_00,uVar6,(ulong)uVar17,puVar13,usage);
      pVVar19 = (this->m_validRanges).
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_validRanges).
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish != pVVar19) {
        (this->m_validRanges).
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar19;
      }
      if (fVar20 < 0.2) {
        local_1a8[0]._M_dataplus._M_p = (pointer)((ulong)uVar17 << 0x20);
        std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
        emplace_back<tcu::Vector<int,2>>(local_2c8,(Vector<int,_2> *)local_1a8);
      }
      this->m_curSize = uVar17;
    }
    else {
      iVar2 = this->m_curSize;
      fVar20 = deRandom_getFloat(&local_1b8);
      fVar20 = powf(fVar20 * 0.7 + 0.0,3.0);
      fVar20 = fVar20 * (float)iVar2;
      iVar8 = (int)(fVar20 + *(float *)(&DAT_006468a8 + (ulong)(fVar20 < 0.0) * 4));
      iVar2 = this->m_curSize;
      iVar11 = iVar8;
      if (iVar2 <= iVar8) {
        iVar11 = iVar2;
      }
      numBytes = 0xc;
      if (0xb < iVar8) {
        numBytes = iVar11;
      }
      dVar7 = deRandom_getUint32(&local_1b8);
      uVar17 = dVar7 % ((iVar2 - numBytes) + 1U);
      offset = (long)(int)uVar17;
      puVar13 = (this->m_refBuffer).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar7 = deRandom_getUint32(&local_1b8);
      BufferTestUtil::fillWithRandomBytes(puVar13 + offset,numBytes,dVar7);
      glu::CallLogWrapper::glBufferSubData
                (this_00,uVar6,offset,(long)numBytes,
                 (this->m_refBuffer).m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + offset);
      local_1f8.m_name._M_dataplus._M_p._4_4_ = numBytes;
      local_1f8.m_name._M_dataplus._M_p._0_4_ = uVar17;
      addRangeToList((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_1a8
                     ,(vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                      local_2c8,(IVec2 *)&local_1f8);
      pVVar19 = (this->m_validRanges).
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (this->m_validRanges).
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_validRanges).
      super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1a8[0]._M_dataplus._M_p;
      (this->m_validRanges).
      super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1a8[0]._M_string_length;
      (this->m_validRanges).
      super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1a8[0].field_2._0_8_;
      local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
      local_1a8[0]._M_string_length = 0;
      local_1a8[0].field_2._M_allocated_capacity = (pointer)0x0;
      if (pVVar19 != (pointer)0x0) {
        operator_delete(pVVar19,(long)pVVar3 - (long)pVVar19);
        if ((pointer)local_1a8[0]._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity -
                          (long)local_1a8[0]._M_dataplus._M_p);
        }
      }
    }
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
  local_290 = glu::CallLogWrapper::glGetError(this_00);
  if (local_290 != 0) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    local_1f8.m_name._M_dataplus._M_p = (pointer)&local_1f8.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Got ","");
    local_298 = glu::getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_330,&local_298);
    std::operator+(local_1a8,&local_1f8.m_name,&local_330);
    tcu::TestError::TestError(this_02,local_1a8);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar19 = (this->m_validRanges).
            super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar14 = 1;
  do {
    if (pVVar19 ==
        (this->m_validRanges).
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00388253:
      tcu::TestLog::endSection
                (((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                 m_log);
      iVar18 = this->m_iterNdx + 1;
      this->m_iterNdx = iVar18;
      return (IterateResult)(iVar18 < 5 & bVar14);
    }
    iVar18 = BufferTestUtil::BufferVerifier::verify
                       (this->m_verifier,(EVP_PKEY_CTX *)(ulong)this->m_buffer,
                        (this->m_refBuffer).m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)(uint)pVVar19->m_data[0],
                        (uchar *)(ulong)(uint)pVVar19->m_data[1],(size_t)in_R9);
    if ((char)iVar18 == '\0') {
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Buffer verification failed");
      bVar14 = 0;
      goto LAB_00388253;
    }
    pVVar19 = pVVar19 + 1;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		// Parameters.
		const int	numIterations				= 5;
		const int	uploadsPerIteration			= 7;
		const int	minSize						= 12;
		const int	maxSize						= 32*1024;
		const float	respecifyProbability		= 0.07f;
		const float	respecifyDataProbability	= 0.2f;

		static const deUint32 bufferTargets[] =
		{
			GL_ARRAY_BUFFER,
			GL_ELEMENT_ARRAY_BUFFER
		};

		static const deUint32 usageHints[] =
		{
			GL_STREAM_DRAW,
			GL_STATIC_DRAW,
			GL_DYNAMIC_DRAW,
		};

		bool		iterOk					= true;
		deUint32	curBoundTarget			= GL_NONE;
		de::Random	rnd						(m_seed ^ deInt32Hash(m_iterNdx) ^ 0xacf92e);

		m_testCtx.getLog() << TestLog::Section(string("Iteration") + de::toString(m_iterNdx+1), string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations));

		for (int uploadNdx = 0; uploadNdx < uploadsPerIteration; uploadNdx++)
		{
			const deUint32	target		= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
			const bool		respecify	= m_curSize == 0 || rnd.getFloat() < respecifyProbability;

			if (target != curBoundTarget)
			{
				glBindBuffer(target, m_buffer);
				curBoundTarget = target;
			}

			if (respecify)
			{
				const int		size			= rnd.getInt(minSize, maxSize);
				const deUint32	hint			= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
				const bool		fillWithData	= rnd.getFloat() < respecifyDataProbability;

				m_refBuffer.setSize(size);
				if (fillWithData)
					fillWithRandomBytes(m_refBuffer.getPtr(), size, rnd.getUint32());

				glBufferData(target, size, fillWithData ? m_refBuffer.getPtr() : DE_NULL, hint);

				m_validRanges.clear();
				if (fillWithData)
					m_validRanges.push_back(tcu::IVec2(0, size));

				m_curSize = size;
			}
			else
			{
				// \note Non-uniform size distribution.
				const int	size	= de::clamp(deRoundFloatToInt32((float)m_curSize * deFloatPow(rnd.getFloat(0.0f, 0.7f), 3.0f)), minSize, m_curSize);
				const int	offset	= rnd.getInt(0, m_curSize-size);

				fillWithRandomBytes(m_refBuffer.getPtr()+offset, size, rnd.getUint32());
				glBufferSubData(target, offset, size, m_refBuffer.getPtr()+offset);

				m_validRanges = addRangeToList(m_validRanges, tcu::IVec2(offset, size));
			}
		}

		// Check error.
		{
			deUint32 err = glGetError();
			if (err != GL_NO_ERROR)
				throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
		}

		// Verify valid ranges.
		for (vector<IVec2>::const_iterator range = m_validRanges.begin(); range != m_validRanges.end(); range++)
		{
			if (!m_verifier->verify(m_buffer, m_refBuffer.getPtr(), range->x(), range->y()))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer verification failed");
				iterOk = false;
				break;
			}
		}

		m_testCtx.getLog() << TestLog::EndSection;

		DE_ASSERT(iterOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);

		m_iterNdx += 1;
		return (iterOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
	}